

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O2

uint __thiscall o3dgc::Arithmetic_Codec::decode(Arithmetic_Codec *this,Adaptive_Data_Model *M)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar7 = this->length;
  if (M->decoder_table == (uint *)0x0) {
    uVar6 = uVar7 >> 0xf;
    this->length = uVar6;
    uVar4 = M->data_symbols;
    uVar8 = uVar4 >> 1;
    uVar5 = this->value;
    uVar3 = 0;
    uVar10 = 0;
    do {
      uVar9 = M->distribution[uVar8] * uVar6;
      uVar2 = uVar8;
      if (uVar9 <= uVar5) {
        uVar2 = uVar4;
        uVar3 = uVar9;
        uVar9 = uVar7;
        uVar10 = uVar8;
      }
      uVar7 = uVar9;
      uVar4 = uVar2;
      uVar8 = uVar10 + uVar4 >> 1;
    } while (uVar8 != uVar10);
  }
  else {
    uVar5 = this->value;
    uVar6 = uVar7 >> 0xf;
    this->length = uVar6;
    uVar4 = uVar5 / uVar6 >> ((byte)M->table_shift & 0x1f);
    puVar1 = M->distribution;
    uVar10 = M->decoder_table[uVar4];
    uVar4 = M->decoder_table[uVar4 + 1] + 1;
    while (uVar3 = uVar4, uVar10 + 1 < uVar3) {
      uVar4 = uVar3 + uVar10 >> 1;
      if (puVar1[uVar4] <= uVar5 / uVar6) {
        uVar10 = uVar4;
        uVar4 = uVar3;
      }
    }
    uVar3 = puVar1[uVar10] * uVar6;
    if (uVar10 != M->last_symbol) {
      uVar7 = uVar6 * puVar1[uVar10 + 1];
    }
  }
  this->value = uVar5 - uVar3;
  this->length = uVar7 - uVar3;
  if (uVar7 - uVar3 < 0x1000000) {
    renorm_dec_interval(this);
  }
  M->symbol_count[uVar10] = M->symbol_count[uVar10] + 1;
  puVar1 = &M->symbols_until_update;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    Adaptive_Data_Model::update(M,false);
  }
  return uVar10;
}

Assistant:

unsigned Arithmetic_Codec::decode(Adaptive_Data_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      unsigned n, s, x, y = length;

      if (M.decoder_table) {              // use table look-up for faster decoding

        unsigned dv = value / (length >>= DM__LengthShift);
        unsigned t = dv >> M.table_shift;

        s = M.decoder_table[t];         // initial decision based on table look-up
        n = M.decoder_table[t+1] + 1;

        while (n > s + 1) {                        // finish with bisection search
          unsigned m = (s + n) >> 1;
          if (M.distribution[m] > dv) n = m; else s = m;
        }
                                                               // compute products
        x = M.distribution[s] * length;
        if (s != M.last_symbol) {
            y = M.distribution[s+1] * length;
        }
      }

      else {                                  // decode using only multiplications

        x = s = 0;
        length >>= DM__LengthShift;
        unsigned m = (n = M.data_symbols) >> 1;
                                                    // decode via bisection search
        do {
          unsigned z = length * M.distribution[m];
          if (z > value) {
            n = m;
            y = z;                                             // value is smaller
          }
          else {
            s = m;
            x = z;                                     // value is larger or equal
          }
        } while ((m = (s + n) >> 1) != s);
      }

      value -= x;                                               // update interval
      length = y - x;

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      ++M.symbol_count[s];
      if (--M.symbols_until_update == 0) M.update(false);  // periodic model update

      return s;
    }